

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rootindexproxymodel.cpp
# Opt level: O2

void __thiscall tst_RootIndexProxyModel::showRoot_data(tst_RootIndexProxyModel *this)

{
  QAbstractItemModel *pQVar1;
  QTestData *pQVar2;
  QAbstractItemModel *local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  QAbstractItemModel *baseModel;
  QModelIndex local_58;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  QTest::addColumn<QAbstractItemModel*>("baseModel",(QAbstractItemModel **)0x0);
  QTest::addColumnInternal(0x2a,"root");
  pQVar2 = (QTestData *)QTest::newRow("Parent");
  local_78 = createTreeModel((QObject *)0x0);
  pQVar2 = operator<<(pQVar2,&local_78);
  local_58.r = -1;
  local_58.c = -1;
  local_58.i = 0;
  local_58.m = (QAbstractItemModel *)0x0;
  operator<<(pQVar2,&local_58);
  baseModel = createTreeModel((QObject *)0x0);
  pQVar2 = (QTestData *)QTest::newRow("Child");
  pQVar2 = operator<<(pQVar2,&baseModel);
  local_78 = (QAbstractItemModel *)0xffffffffffffffff;
  local_70 = 0;
  uStack_68 = 0;
  (**(code **)(*(long *)baseModel + 0x60))(&local_58,baseModel,1,0,&local_78);
  operator<<(pQVar2,&local_58);
  baseModel = createTreeModel((QObject *)0x0);
  pQVar2 = (QTestData *)QTest::newRow("Grandchild");
  pQVar2 = operator<<(pQVar2,&baseModel);
  pQVar1 = baseModel;
  local_40 = 0xffffffffffffffff;
  local_38 = 0;
  uStack_30 = 0;
  (**(code **)(*(long *)baseModel + 0x60))(&local_78,baseModel,1,0);
  (**(code **)(*(long *)pQVar1 + 0x60))(&local_58,pQVar1,2,0,&local_78);
  operator<<(pQVar2,&local_58);
  return;
}

Assistant:

void tst_RootIndexProxyModel::showRoot_data()
{
#ifdef COMPLEX_MODEL_SUPPORT
    QTest::addColumn<QAbstractItemModel *>("baseModel");
    QTest::addColumn<QModelIndex>("root");
    QTest::newRow("Parent") << createTreeModel(nullptr) << QModelIndex();
    QAbstractItemModel *baseModel = createTreeModel(nullptr);
    QTest::newRow("Child") << baseModel << baseModel->index(1, 0);
    baseModel = createTreeModel(nullptr);
    QTest::newRow("Grandchild") << baseModel << baseModel->index(2, 0, baseModel->index(1, 0));
#else
    QSKIP("This test requires the Qt GUI or GenericModel modules");
#endif
}